

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall
libtorrent::dht::node::get_item
          (node *this,sha1_hash *target,function<void_(const_libtorrent::dht::item_&)> *f)

{
  dht_observer *pdVar1;
  int iVar2;
  difference_type in_RCX;
  span<const_char> in;
  shared_ptr<libtorrent::dht::get_item> ta;
  undefined1 local_81;
  get_item *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  _Any_data local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  pdVar1 = this->m_observer;
  if (pdVar1 != (dht_observer *)0x0) {
    iVar2 = (**(pdVar1->super_dht_logger)._vptr_dht_logger)(pdVar1,1);
    if ((char)iVar2 != '\0') {
      pdVar1 = this->m_observer;
      in.m_len = in_RCX;
      in.m_ptr = (char *)0x14;
      aux::to_hex_abi_cxx11_((string *)&local_70,(aux *)target,in);
      (*(pdVar1->super_dht_logger)._vptr_dht_logger[1])
                (pdVar1,1,"starting get for [ hash: %s ]",local_70._M_unused._M_object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_unused._0_8_ != &local_60) {
        operator_delete(local_70._M_unused._M_object,(ulong)(local_60._M_allocated_capacity + 1));
      }
    }
  }
  ::std::function<void_(const_libtorrent::dht::item_&)>::function
            ((function<void_(const_libtorrent::dht::item_&)> *)&local_70,f);
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_80 = (get_item *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<libtorrent::dht::get_item,std::allocator<libtorrent::dht::get_item>,libtorrent::dht::node&,libtorrent::digest32<160l>const&,std::_Bind<std::function<void(libtorrent::dht::item_const&)>(std::_Placeholder<1>)>,std::function<void(std::vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>const&)>>
            (&local_78,&local_80,(allocator<libtorrent::dht::get_item> *)&local_81,this,target,
             (_Bind<std::function<void_(const_libtorrent::dht::item_&)>_(std::_Placeholder<1>)> *)
             &local_70,
             (function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
              *)&local_48);
  ::std::__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<libtorrent::dht::get_item,libtorrent::dht::get_item>
            ((__shared_ptr<libtorrent::dht::get_item,(__gnu_cxx::_Lock_policy)2> *)&local_80,
             local_80);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if ((code *)local_60._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_60._M_allocated_capacity)(&local_70,&local_70,3);
  }
  (*(local_80->super_find_data).super_traversal_algorithm._vptr_traversal_algorithm[3])();
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
  return;
}

Assistant:

void node::get_item(sha1_hash const& target, std::function<void(item const&)> f)
{
#ifndef TORRENT_DISABLE_LOGGING
	if (m_observer != nullptr && m_observer->should_log(dht_logger::node))
	{
		m_observer->log(dht_logger::node, "starting get for [ hash: %s ]"
			, aux::to_hex(target).c_str());
	}
#endif

	auto ta = std::make_shared<dht::get_item>(*this, target
		, std::bind(f, _1), find_data::nodes_callback());
	ta->start();
}